

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O1

void __thiscall
Lib::Array<Parse::TPTP::Token>::expandToFit(Array<Parse::TPTP::Token> *this,size_t n)

{
  bool bVar1;
  uint uVar2;
  Token *pTVar3;
  Token *pTVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  string *psVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  Token *res;
  
  uVar5 = this->_capacity * 2;
  uVar11 = n + 1;
  if (n < uVar5) {
    uVar11 = uVar5;
  }
  uVar7 = uVar11 * 0x28 + 0xf & 0xfffffffffffffff0;
  uVar5 = uVar11;
  if (uVar7 == 0) {
    pTVar3 = (Token *)FixedSizeAllocator<8UL>::alloc
                                ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    pTVar4 = pTVar3;
  }
  else if (uVar7 < 0x11) {
    pTVar3 = (Token *)FixedSizeAllocator<16UL>::alloc
                                ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18))
    ;
    pTVar4 = pTVar3;
  }
  else if (uVar7 < 0x19) {
    pTVar3 = (Token *)FixedSizeAllocator<24UL>::alloc
                                ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30))
    ;
    pTVar4 = pTVar3;
  }
  else if (uVar7 < 0x21) {
    pTVar3 = (Token *)FixedSizeAllocator<32UL>::alloc
                                ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48))
    ;
    pTVar4 = pTVar3;
  }
  else if (uVar7 < 0x31) {
    pTVar3 = (Token *)FixedSizeAllocator<48UL>::alloc
                                ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60))
    ;
    pTVar4 = pTVar3;
  }
  else if (uVar7 < 0x41) {
    pTVar3 = (Token *)FixedSizeAllocator<64UL>::alloc
                                ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78))
    ;
    pTVar4 = pTVar3;
  }
  else {
    pTVar3 = (Token *)::operator_new(uVar7,0x10);
    pTVar4 = pTVar3;
  }
  for (; uVar5 != 0; uVar5 = uVar5 - 1) {
    *(undefined8 *)pTVar3 = 0;
    (pTVar3->content)._M_dataplus._M_p = (pointer)0x0;
    (pTVar3->content)._M_string_length = 0;
    (pTVar3->content).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pTVar3->content).field_2 + 8) = 0;
    (pTVar3->content)._M_dataplus._M_p = (pointer)&(pTVar3->content).field_2;
    (pTVar3->content)._M_string_length = 0;
    (pTVar3->content).field_2._M_local_buf[0] = '\0';
    pTVar3 = pTVar3 + 1;
  }
  if ((this->_capacity != 0) && (uVar2 = (int)this->_capacity - 1, -1 < (int)uVar2)) {
    uVar5 = (ulong)uVar2;
    lVar6 = uVar5 * 0x28 + 8;
    psVar8 = (string *)&pTVar4[uVar5].content;
    lVar9 = uVar5 + 1;
    do {
      *(undefined4 *)(psVar8 + -8) = *(undefined4 *)((long)this->_array + lVar6 + -8);
      std::__cxx11::string::_M_assign(psVar8);
      psVar8 = psVar8 + -0x28;
      lVar6 = lVar6 + -0x28;
      lVar10 = lVar9 + -1;
      bVar1 = 0 < lVar9;
      lVar9 = lVar10;
    } while (lVar10 != 0 && bVar1);
  }
  if (this->_array != (Token *)0x0) {
    array_delete<Parse::TPTP::Token>(this->_array,this->_capacity);
    pTVar3 = this->_array;
    if (pTVar3 != (Token *)0x0) {
      uVar5 = this->_capacity * 0x28 + 0xf & 0xfffffffffffffff0;
      if (uVar5 == 0) {
        *(undefined8 *)pTVar3 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pTVar3;
      }
      else if (uVar5 < 0x11) {
        *(undefined8 *)pTVar3 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pTVar3;
      }
      else if (uVar5 < 0x19) {
        *(undefined8 *)pTVar3 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pTVar3;
      }
      else if (uVar5 < 0x21) {
        *(undefined8 *)pTVar3 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pTVar3;
      }
      else if (uVar5 < 0x31) {
        *(undefined8 *)pTVar3 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pTVar3;
      }
      else if (uVar5 < 0x41) {
        *(undefined8 *)pTVar3 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pTVar3;
      }
      else {
        operator_delete(pTVar3,0x10);
      }
    }
  }
  this->_array = pTVar4;
  (**this->_vptr_Array)(this,this->_capacity,uVar11);
  this->_capacity = uVar11;
  return;
}

Assistant:

void expandToFit (size_t n)
  {
    ASS(n >= _capacity);

    // determine new capacity (at least double the old one)
    size_t newCapacity = 2 * _capacity;
    if (newCapacity <= n) {
      newCapacity = n+1;
    }

    // allocate new array and copy old array's content to the new place
    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"Array<>");
    C* newArray = array_new<C>(mem, newCapacity);
    if(_capacity) {
      for (int i = _capacity-1;i >= 0;i--) {
	newArray[i] = _array[i];
      }
    }

    if(_array) {
      // deallocate the old array
      array_delete(_array,_capacity);
      DEALLOC_KNOWN(_array,_capacity*sizeof(C),"Array<>");
    }

    _array = newArray;
    fillInterval(_capacity,newCapacity);
    _capacity = newCapacity;
  }